

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

void luaL_addgsub(luaL_Buffer *b,char *s,char *p,char *r)

{
  size_t sVar1;
  char *pcVar2;
  char *__dest;
  size_t sz;
  
  sVar1 = strlen(p);
  pcVar2 = strstr(s,p);
  while (pcVar2 != (char *)0x0) {
    sz = (long)pcVar2 - (long)s;
    if (sz != 0) {
      __dest = prepbuffsize(b,sz,-1);
      memcpy(__dest,s,sz);
      b->n = b->n + sz;
    }
    luaL_addstring(b,r);
    s = pcVar2 + sVar1;
    pcVar2 = strstr(s,p);
  }
  luaL_addstring(b,s);
  return;
}

Assistant:

LUALIB_API void luaL_addgsub (luaL_Buffer *b, const char *s,
                                     const char *p, const char *r) {
  const char *wild;
  size_t l = strlen(p);
  while ((wild = strstr(s, p)) != NULL) {
    luaL_addlstring(b, s, wild - s);  /* push prefix */
    luaL_addstring(b, r);  /* push replacement in place of pattern */
    s = wild + l;  /* continue after 'p' */
  }
  luaL_addstring(b, s);  /* push last suffix */
}